

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O0

bool __thiscall cmCMakePath::IsPrefix(cmCMakePath *this,cmCMakePath *path)

{
  bool bVar1;
  reference __lhs;
  reference __rhs;
  pointer this_00;
  bool local_92;
  bool local_91;
  bool local_81;
  undefined1 local_78 [8];
  iterator path_end;
  iterator path_it;
  iterator prefix_end;
  iterator prefix_it;
  cmCMakePath *path_local;
  cmCMakePath *this_local;
  
  std::filesystem::__cxx11::path::begin((iterator *)&prefix_end._M_at_end,&this->Path);
  std::filesystem::__cxx11::path::end((iterator *)&path_it._M_at_end,&this->Path);
  std::filesystem::__cxx11::path::begin((iterator *)&path_end._M_at_end,&path->Path);
  std::filesystem::__cxx11::path::end((iterator *)local_78,&path->Path);
  while( true ) {
    bVar1 = std::filesystem::__cxx11::operator!=
                      ((iterator *)&prefix_end._M_at_end,(iterator *)&path_it._M_at_end);
    local_81 = false;
    if (bVar1) {
      bVar1 = std::filesystem::__cxx11::operator!=
                        ((iterator *)&path_end._M_at_end,(iterator *)local_78);
      local_81 = false;
      if (bVar1) {
        __lhs = std::filesystem::__cxx11::path::iterator::operator*
                          ((iterator *)&prefix_end._M_at_end);
        __rhs = std::filesystem::__cxx11::path::iterator::operator*((iterator *)&path_end._M_at_end)
        ;
        local_81 = std::filesystem::__cxx11::operator==(__lhs,__rhs);
      }
    }
    if (local_81 == false) break;
    std::filesystem::__cxx11::path::iterator::operator++((iterator *)&prefix_end._M_at_end);
    std::filesystem::__cxx11::path::iterator::operator++((iterator *)&path_end._M_at_end);
  }
  bVar1 = std::filesystem::__cxx11::operator==
                    ((iterator *)&prefix_end._M_at_end,(iterator *)&path_it._M_at_end);
  local_91 = true;
  if (!bVar1) {
    this_00 = std::filesystem::__cxx11::path::iterator::operator->
                        ((iterator *)&prefix_end._M_at_end);
    bVar1 = std::filesystem::__cxx11::path::empty(this_00);
    local_92 = false;
    if (bVar1) {
      local_92 = std::filesystem::__cxx11::operator!=
                           ((iterator *)&path_end._M_at_end,(iterator *)local_78);
    }
    local_91 = local_92;
  }
  return local_91;
}

Assistant:

bool cmCMakePath::IsPrefix(const cmCMakePath& path) const
{
  auto prefix_it = this->Path.begin();
  auto prefix_end = this->Path.end();
  auto path_it = path.Path.begin();
  auto path_end = path.Path.end();

  while (prefix_it != prefix_end && path_it != path_end &&
         *prefix_it == *path_it) {
    ++prefix_it;
    ++path_it;
  }
  return (prefix_it == prefix_end) ||
    (prefix_it->empty() && path_it != path_end);
}